

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# talg.c
# Opt level: O1

int diff(double *sig,int N,int d,double *oup)

{
  double dVar1;
  double *C;
  double *pdVar2;
  long lVar3;
  double *pdVar4;
  long lVar5;
  long lVar6;
  double dVar7;
  
  lVar6 = (long)d;
  C = (double *)malloc(lVar6 * 8 + 8);
  deld(d,C);
  if (N - d != 0 && d <= N) {
    dVar1 = *C;
    pdVar2 = sig + lVar6;
    lVar5 = lVar6;
    do {
      dVar7 = 0.0;
      if (0 < d) {
        lVar3 = -1;
        pdVar4 = C;
        do {
          pdVar4 = pdVar4 + 1;
          dVar7 = dVar7 + pdVar2[lVar3] * *pdVar4;
          lVar3 = lVar3 + -1;
        } while (-lVar3 != (ulong)(d + 1));
      }
      oup[lVar5 - lVar6] = sig[lVar5] * dVar1 + dVar7;
      lVar5 = lVar5 + 1;
      pdVar2 = pdVar2 + 1;
    } while (lVar5 != N);
  }
  free(C);
  return N - d;
}

Assistant:

int diff(double *sig, int N, int d, double *oup) {
	int Noup,i,j;
	double *coeff;
	double sum;
	/*
	 * 
	 * diff output = [ X(t) - X(t-1) ] ^ d where X(t) is the
	 * input timeseries of length N
	 * output is of length N - d
	 * 
	 * diff is used to detrend data
	 * 
	 * d=1 typically takes care of linear trend while
	 * d=2 handles quadratic trend
	 */ 
	
	coeff = (double*) malloc(sizeof(double) * (d+1));
	deld(d,coeff);
	Noup = N - d;
	
	for(i = d; i < N;++i) {
		sum = 0.;
		for(j = 1; j < d+1;++j) {
			sum += sig[i-j]*coeff[j];
		}
		oup[i-d] = sum + coeff[0] * sig[i];
		
	}

	free(coeff);
	
	
	return Noup;
}